

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void updateObjects(QList<const_QObject_*> *objects)

{
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  QObject **ppQVar4;
  long lVar5;
  QWidget *this;
  QStyle *pQVar6;
  long lVar7;
  QObject **ppQVar8;
  long lVar9;
  QList<const_QObject_*> *__range2;
  long in_FS_OFFSET;
  QObject *object;
  QObject **ppQStack_60;
  qsizetype local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (styleSheetCaches->styleRulesCache).d;
  if ((((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) ||
      ((pDVar2 = (styleSheetCaches->hasStyleRuleCache).d, pDVar2 != (Data *)0x0 &&
       (pDVar2->size != 0)))) ||
     ((pDVar3 = (styleSheetCaches->renderRulesCache).d, pDVar3 != (Data *)0x0 && (pDVar3->size != 0)
      ))) {
    ppQVar4 = (objects->d).ptr;
    lVar5 = (objects->d).size;
    for (lVar9 = 0; lVar5 << 3 != lVar9; lVar9 = lVar9 + 8) {
      object = *(QObject **)((long)ppQVar4 + lVar9);
      QHash<QObject_const*,QList<QCss::StyleRule>>::removeImpl<QObject_const*>
                ((QHash<QObject_const*,QList<QCss::StyleRule>> *)&styleSheetCaches->styleRulesCache,
                 &object);
      QHash<QObject_const*,QHash<int,bool>>::removeImpl<QObject_const*>
                ((QHash<QObject_const*,QHash<int,bool>> *)&styleSheetCaches->hasStyleRuleCache,
                 &object);
      QHash<QObject_const*,QHash<int,QHash<unsigned_long_long,QRenderRule>>>::
      removeImpl<QObject_const*>
                ((QHash<QObject_const*,QHash<int,QHash<unsigned_long_long,QRenderRule>>> *)
                 &styleSheetCaches->renderRulesCache,&object);
    }
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,StyleChange);
  ppQVar8 = (objects->d).ptr;
  ppQVar4 = ppQVar8 + (objects->d).size;
  for (; ppQVar8 != ppQVar4; ppQVar8 = ppQVar8 + 1) {
    this = (QWidget *)*ppQVar8;
    if ((this != (QWidget *)0x0) && ((*(byte *)(*(long *)&this->field_0x8 + 0x30) & 1) != 0)) {
      pQVar6 = QWidget::style(this);
      (**(code **)(*(long *)pQVar6 + 0x60))(pQVar6,this);
      QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_48);
      local_58 = 0;
      object = (QObject *)0x0;
      ppQStack_60 = (QObject **)0x0;
      QList<const_QObject_*>::reserve
                ((QList<const_QObject_*> *)&object,*(long *)(*(long *)&this->field_0x8 + 0x28) + 1);
      lVar5 = *(long *)(*(long *)&this->field_0x8 + 0x20);
      lVar9 = *(long *)(*(long *)&this->field_0x8 + 0x28);
      for (lVar7 = 0; lVar9 << 3 != lVar7; lVar7 = lVar7 + 8) {
        QList<const_QObject_*>::append
                  ((QList<const_QObject_*> *)&object,*(parameter_type *)(lVar5 + lVar7));
      }
      updateObjects((QList<const_QObject_*> *)&object);
      QArrayDataPointer<const_QObject_*>::~QArrayDataPointer
                ((QArrayDataPointer<const_QObject_*> *)&object);
    }
  }
  QEvent::~QEvent((QEvent *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void updateObjects(const QList<const QObject *>& objects)
{
    if (!styleSheetCaches->styleRulesCache.isEmpty() || !styleSheetCaches->hasStyleRuleCache.isEmpty() || !styleSheetCaches->renderRulesCache.isEmpty()) {
        for (const QObject *object : objects) {
            styleSheetCaches->styleRulesCache.remove(object);
            styleSheetCaches->hasStyleRuleCache.remove(object);
            styleSheetCaches->renderRulesCache.remove(object);
        }
    }

    QEvent event(QEvent::StyleChange);
    for (const QObject *object : objects) {
        if (auto widget = qobject_cast<QWidget*>(const_cast<QObject*>(object))) {
            widget->style()->polish(widget);
            QCoreApplication::sendEvent(widget, &event);
            QList<const QObject *> children;
            children.reserve(widget->children().size() + 1);
            for (auto child: std::as_const(widget->children()))
                children.append(child);
            updateObjects(children);
        }
    }
}